

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveNonJSOps.cpp
# Opt level: O3

void __thiscall wasm::RemoveNonJSOpsPass::doWalkModule(RemoveNonJSOpsPass *this,Module *module)

{
  __node_base *p_Var1;
  Index *this_00;
  _List_node_base *p_Var2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  _List_node_base *p_Var5;
  char *pcVar6;
  Builder *pBVar7;
  Element *module_00;
  Function *pFVar8;
  _Rb_tree_node_base *p_Var9;
  Global *pGVar10;
  ulong in_RCX;
  _Hash_node_base *p_Var11;
  Element **in_R8;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *global;
  __node_base *p_Var12;
  string_view sVar13;
  undefined1 local_698 [8];
  SExpressionWasmBuilder builder;
  Module intrinsicsModule;
  SExpressionParser parser;
  set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> neededFunctions;
  string input;
  _Head_base<0UL,_wasm::Memory_*,_false> local_38;
  unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> memory;
  
  auVar3._8_8_ = 0;
  auVar3._0_8_ = in_RCX;
  ABI::wasm2js::ensureHelpers((wasm2js *)module,(Module *)0x0,(IString)(auVar3 << 0x40));
  if ((this->builder)._M_t.super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
      ._M_t.super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
      super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl == (Builder *)0x0) {
    pBVar7 = (Builder *)operator_new(8);
    pBVar7->wasm = module;
    (this->builder)._M_t.super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>.
    _M_t.super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
    super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl = pBVar7;
  }
  Walker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>::doWalkModule
            (&(this->
              super_WalkerPass<wasm::PostWalker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>_>
              ).
              super_PostWalker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>
              .
              super_Walker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>
             ,module);
  if ((this->neededIntrinsics)._M_h._M_element_count != 0) {
    Module::Module((Module *)&builder.nameMapper.otherIndex);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&neededFunctions._M_t._M_impl.super__Rb_tree_header._M_node_count,
               IntrinsicsModuleWast,(allocator<char> *)local_698);
    SExpressionParser::SExpressionParser
              ((SExpressionParser *)&intrinsicsModule.tagsMap._M_h._M_single_bucket,
               (char *)neededFunctions._M_t._M_impl.super__Rb_tree_header._M_node_count);
    module_00 = Element::operator[]((Element *)parser.allocator.next._M_b._M_p,0);
    p_Var11 = (_Hash_node_base *)0x0;
    SExpressionWasmBuilder::SExpressionWasmBuilder
              ((SExpressionWasmBuilder *)local_698,(Module *)&builder.nameMapper.otherIndex,
               module_00,Normal);
    neededFunctions._M_t._M_impl._0_4_ = 0;
    neededFunctions._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    neededFunctions._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    neededFunctions._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    neededFunctions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Rb_tree_node_base *)&neededFunctions;
    neededFunctions._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Rb_tree_node_base *)&neededFunctions;
    if ((this->neededIntrinsics)._M_h._M_element_count != 0) {
      input.field_2._8_8_ = &this->neededIntrinsics;
      p_Var1 = &(this->neededIntrinsics)._M_h._M_before_begin;
      this_00 = &builder.nameMapper.otherIndex;
      p_Var12 = p_Var1;
      do {
        while (p_Var12 = p_Var12->_M_nxt, p_Var12 != (__node_base *)0x0) {
          p_Var11 = *(_Hash_node_base **)
                     &((_Prime_rehash_policy *)(p_Var12 + 2))->_M_max_load_factor;
          in_R8 = &parser.root;
          addNeededFunctions(this,(Module *)this_00,(Name)*(string_view *)(p_Var12 + 1),
                             (set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)
                             in_R8);
        }
        std::
        _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::clear((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)input.field_2._8_8_);
        for (p_Var9 = neededFunctions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            p_Var9 != (_Rb_tree_node_base *)&neededFunctions;
            p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
          pFVar8 = Module::getFunctionOrNull(module,(Name)*(string_view *)(p_Var9 + 1));
          if (pFVar8 == (Function *)0x0) {
            pFVar8 = Module::getFunction((Module *)this_00,(Name)*(string_view *)(p_Var9 + 1));
            p_Var11 = (_Hash_node_base *)0x0;
            auVar4._8_8_ = 0;
            auVar4._0_8_ = in_R8;
            pFVar8 = wasm::ModuleUtils::copyFunction
                               ((ModuleUtils *)pFVar8,(Function *)module,(Module *)0x0,
                                (Name)(auVar4 << 0x40));
          }
          doWalkFunction(this,pFVar8);
        }
        std::
        _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
        ::clear((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)&parser.root);
        p_Var12 = p_Var1;
      } while ((this->neededIntrinsics)._M_h._M_element_count != 0);
    }
    for (; intrinsicsModule.functions.
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage !=
           (pointer)intrinsicsModule.globals.
                    super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        intrinsicsModule.functions.
        super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             intrinsicsModule.functions.
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
      wasm::ModuleUtils::copyGlobal
                ((Global *)
                 ((intrinsicsModule.functions.
                   super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_t).
                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                 super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,module);
    }
    if ((module->memories).
        super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (module->memories).
        super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      sVar13 = IString::interned((IString *)&DAT_00000001,(string_view)ZEXT816(0xb7caff),
                                 SUB81(p_Var11,0));
      local_38._M_head_impl = (Memory *)operator_new(0x58);
      ((local_38._M_head_impl)->max).addr = 0;
      *(undefined8 *)&(local_38._M_head_impl)->shared = 0;
      ((local_38._M_head_impl)->super_Importable).base.super_IString.str._M_str = (char *)0x0;
      ((local_38._M_head_impl)->initial).addr = 0;
      ((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_str = (char *)0x0;
      ((local_38._M_head_impl)->super_Importable).base.super_IString.str._M_len = 0;
      *(undefined8 *)&((local_38._M_head_impl)->super_Importable).super_Named.hasExplicitName = 0;
      ((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_len = 0;
      ((local_38._M_head_impl)->super_Importable).super_Named.name.super_IString.str = sVar13;
      ((local_38._M_head_impl)->indexType).id = 2;
      ((local_38._M_head_impl)->max).addr = 1;
      ((local_38._M_head_impl)->initial).addr = 1;
      Module::addMemory(module,(unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *)
                               &local_38);
      if (local_38._M_head_impl != (Memory *)0x0) {
        operator_delete(local_38._M_head_impl,0x58);
      }
    }
    for (p_Var2 = (this->neededImportedGlobals).List.
                  super__List_base<std::pair<wasm::Name,_wasm::Type>,_std::allocator<std::pair<wasm::Name,_wasm::Type>_>_>
                  ._M_impl._M_node.super__List_node_base._M_next;
        p_Var2 != (_List_node_base *)&(this->neededImportedGlobals).List; p_Var2 = p_Var2->_M_next)
    {
      pGVar10 = Module::getGlobalOrNull
                          ((this->
                           super_WalkerPass<wasm::PostWalker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>_>
                           ).
                           super_PostWalker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>
                           .
                           super_Walker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>
                           .currModule,(IString)*(IString *)&p_Var2[1]._M_next);
      if (pGVar10 == (Global *)0x0) {
        pGVar10 = (Global *)operator_new(0x50);
        pGVar10->init = (Expression *)0x0;
        *(undefined8 *)&pGVar10->mutable_ = 0;
        (pGVar10->super_Importable).base.super_IString.str._M_str = (char *)0x0;
        (pGVar10->type).id = 0;
        (pGVar10->super_Importable).module.super_IString.str._M_str = (char *)0x0;
        (pGVar10->super_Importable).base.super_IString.str._M_len = 0;
        *(undefined8 *)&(pGVar10->super_Importable).super_Named.hasExplicitName = 0;
        (pGVar10->super_Importable).module.super_IString.str._M_len = 0;
        (pGVar10->super_Importable).super_Named.name.super_IString.str._M_len = 0;
        (pGVar10->super_Importable).super_Named.name.super_IString.str._M_str = (char *)0x0;
        p_Var5 = p_Var2[1]._M_prev;
        (pGVar10->super_Importable).super_Named.name.super_IString.str._M_len =
             (size_t)p_Var2[1]._M_next;
        (pGVar10->super_Importable).super_Named.name.super_IString.str._M_str = (char *)p_Var5;
        (pGVar10->type).id = (uintptr_t)p_Var2[2]._M_next;
        pGVar10->mutable_ = false;
        pcVar6 = DAT_00da8600;
        (pGVar10->super_Importable).module.super_IString.str._M_len = ENV;
        (pGVar10->super_Importable).module.super_IString.str._M_str = pcVar6;
        p_Var5 = p_Var2[1]._M_prev;
        (pGVar10->super_Importable).base.super_IString.str._M_len = (size_t)p_Var2[1]._M_next;
        (pGVar10->super_Importable).base.super_IString.str._M_str = (char *)p_Var5;
        Module::addGlobal(module,pGVar10);
      }
    }
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)&parser.root);
    SExpressionWasmBuilder::~SExpressionWasmBuilder((SExpressionWasmBuilder *)local_698);
    MixedArena::~MixedArena((MixedArena *)&parser.loc);
    if ((size_type *)neededFunctions._M_t._M_impl.super__Rb_tree_header._M_node_count !=
        &input._M_string_length) {
      operator_delete((void *)neededFunctions._M_t._M_impl.super__Rb_tree_header._M_node_count,
                      input._M_string_length + 1);
    }
    Module::~Module((Module *)&builder.nameMapper.otherIndex);
  }
  return;
}

Assistant:

void doWalkModule(Module* module) {
    // Intrinsics may use scratch memory, ensure it.
    ABI::wasm2js::ensureHelpers(module);

    // Discover all of the intrinsics that we need to inject, lowering all
    // operations to intrinsic calls while we're at it.
    if (!builder) {
      builder = std::make_unique<Builder>(*module);
    }
    PostWalker<RemoveNonJSOpsPass>::doWalkModule(module);

    if (neededIntrinsics.size() == 0) {
      return;
    }

    // Parse the wat blob we have at the end of this file.
    //
    // TODO: only do this once per invocation of wasm2asm
    Module intrinsicsModule;
    std::string input(IntrinsicsModuleWast);
    SExpressionParser parser(const_cast<char*>(input.c_str()));
    Element& root = *parser.root;
    SExpressionWasmBuilder builder(
      intrinsicsModule, *root[0], IRProfile::Normal);

    std::set<Name> neededFunctions;

    // Iteratively link intrinsics from `intrinsicsModule` into our destination
    // module, as needed.
    //
    // Note that intrinsics often use one another. For example the 64-bit
    // division intrinsic ends up using the 32-bit ctz intrinsic, but does so
    // via a native instruction. The loop here is used to continuously reprocess
    // injected intrinsics to ensure that they never contain non-js ops when
    // we're done.
    while (neededIntrinsics.size() > 0) {
      // Recursively probe all needed intrinsics for transitively used
      // functions. This is building up a set of functions we'll link into our
      // module.
      for (auto& name : neededIntrinsics) {
        addNeededFunctions(intrinsicsModule, name, neededFunctions);
      }
      neededIntrinsics.clear();

      // Link in everything that wasn't already linked in. After we've done the
      // copy we then walk the function to rewrite any non-js operations it has
      // as well.
      for (auto& name : neededFunctions) {
        auto* func = module->getFunctionOrNull(name);
        if (!func) {
          func = ModuleUtils::copyFunction(intrinsicsModule.getFunction(name),
                                           *module);
        }
        doWalkFunction(func);
      }
      neededFunctions.clear();
    }

    // Copy all the globals in the intrinsics module
    for (auto& global : intrinsicsModule.globals) {
      ModuleUtils::copyGlobal(global.get(), *module);
    }

    // Intrinsics may use memory, so ensure the module has one.
    MemoryUtils::ensureExists(module);

    // Add missing globals
    for (auto& [name, type] : neededImportedGlobals) {
      if (!getModule()->getGlobalOrNull(name)) {
        auto global = std::make_unique<Global>();
        global->name = name;
        global->type = type;
        global->mutable_ = false;
        global->module = ENV;
        global->base = name;
        module->addGlobal(global.release());
      }
    }
  }